

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O0

Sexp * GcHeap::AllocateSymbol(size_t sym)

{
  Sexp *pSVar1;
  Sexp *s;
  size_t sym_local;
  
  if (g_heap == (GcHeap *)0x0) {
    __assert_fail("g_heap != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.h"
                  ,0xd6,"static Sexp *GcHeap::AllocateSymbol(size_t)");
  }
  pSVar1 = Allocate(g_heap,false);
  if (pSVar1 != (Sexp *)0x0) {
    pSVar1->kind = SYMBOL;
    (pSVar1->field_1).symbol_value = sym;
    return pSVar1;
  }
  __assert_fail("s != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/gc.h",
                0xd8,"static Sexp *GcHeap::AllocateSymbol(size_t)");
}

Assistant:

static Sexp *AllocateSymbol(size_t sym) {
    assert(g_heap != nullptr);
    Sexp *s = g_heap->Allocate(false);
    assert(s != nullptr);
    s->kind = Sexp::Kind::SYMBOL;
    s->symbol_value = sym;
    return s;
  }